

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

void __thiscall soplex::SPxDevexPR<double>::left4(SPxDevexPR<double> *this,int n,SPxId id)

{
  double dVar1;
  bool bVar2;
  UpdateVector<double> *pUVar3;
  double *pdVar4;
  IdxSet *this_00;
  IdxSet *this_01;
  char *pcVar5;
  double *pdVar6;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  int in_ESI;
  SSVectorBase<double> *in_RDI;
  double dVar8;
  VectorBase<double> *this_02;
  int len;
  IdxSet *rhoIdx;
  double beta_q;
  double rhov_1;
  double *rhoVec;
  double x;
  int j;
  int i;
  VectorBase<double> *coWeights;
  int in_stack_ffffffffffffff8c;
  VectorBase<double> *in_stack_ffffffffffffff90;
  uint local_24;
  SPxId local_8;
  
  bVar2 = SPxId::isValid(&local_8);
  if (bVar2) {
    pUVar3 = SPxSolverBase<double>::fVec((SPxSolverBase<double> *)(in_RDI->super_IdxSet).idx);
    UpdateVector<double>::delta(pUVar3);
    pdVar4 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2a6f7c);
    dVar1 = pdVar4[in_ESI];
    pUVar3 = SPxSolverBase<double>::coPvec((SPxSolverBase<double> *)(in_RDI->super_IdxSet).idx);
    UpdateVector<double>::delta(pUVar3);
    dVar8 = SSVectorBase<double>::length2(in_RDI);
    this_02 = (VectorBase<double> *)(dVar8 * (1.0 / dVar1) * (1.0 / dVar1));
    SPxSolverBase<double>::fVec((SPxSolverBase<double> *)(in_RDI->super_IdxSet).idx);
    this_00 = UpdateVector<double>::idx((UpdateVector<double> *)0x2a6fe7);
    SPxSolverBase<double>::fVec((SPxSolverBase<double> *)(in_RDI->super_IdxSet).idx);
    this_01 = UpdateVector<double>::idx((UpdateVector<double> *)0x2a7005);
    local_24 = IdxSet::size(this_01);
    uVar7 = extraout_RDX;
    while (local_24 = local_24 - 1, -1 < (int)local_24) {
      pcVar5 = IdxSet::index(this_00,(char *)(ulong)local_24,(int)uVar7);
      dVar1 = pdVar4[(int)pcVar5];
      dVar8 = pdVar4[(int)pcVar5];
      pdVar6 = VectorBase<double>::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      *pdVar6 = dVar1 * dVar8 * (double)this_02 + *pdVar6;
      uVar7 = extraout_RDX_00;
    }
    pdVar4 = VectorBase<double>::operator[](this_02,in_stack_ffffffffffffff8c);
    *pdVar4 = (double)this_02;
  }
  return;
}

Assistant:

void SPxDevexPR<R>::left4(int n, SPxId id)
{
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(id.isValid())
   {
      int i, j;
      R x;
      const R* rhoVec = this->thesolver->fVec().delta().values();
      R rhov_1 = 1 / rhoVec[n];
      R beta_q = this->thesolver->coPvec().delta().length2() * rhov_1 * rhov_1;

#ifndef NDEBUG

      if(spxAbs(rhoVec[n]) < this->thetolerance)
      {
         SPX_MSG_INFO3((*this->thesolver->spxout), (*this->thesolver->spxout) << "WDEVEX01: rhoVec = "
                       << rhoVec[n] << " with smaller absolute value than this->thetolerance = " << this->thetolerance <<
                       std::endl;)
      }

#endif  // NDEBUG

      //  Update #coPenalty# vector
      const IdxSet& rhoIdx = this->thesolver->fVec().idx();
      int len = this->thesolver->fVec().idx().size();

      for(i = len - 1; i >= 0; --i)
      {
         j = rhoIdx.index(i);
         x = rhoVec[j] * rhoVec[j] * beta_q;
         // if(x > coPenalty[j])
         coWeights[j] += x;
      }

      coWeights[n] = beta_q;
   }
}